

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O3

void vkt::ubo::anon_unknown_0::generateCompareSrc
               (ostringstream *src,char *resultVar,ShaderInterface *interface,UniformLayout *layout,
               map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
               *blockPointers,bool isVertex,MatrixLoadFlags matrixLoadFlag)

{
  pointer *ppBVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  size_type sVar3;
  pointer pSVar4;
  pointer piVar5;
  int iVar6;
  undefined8 *puVar7;
  long *plVar8;
  pointer pcVar9;
  long lVar10;
  size_type *psVar11;
  SharedPtrStateBase **ppSVar12;
  pointer pBVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  pointer pBVar17;
  ulong uVar18;
  ulong uVar19;
  pointer pBVar20;
  undefined8 uVar21;
  byte bVar22;
  undefined7 in_register_00000089;
  pointer pcVar23;
  pointer pcVar24;
  uint uVar25;
  MatrixLoadFlags matrixLoadFlag_00;
  int local_2a8;
  string srcPrefix;
  string srcName;
  string apiName;
  string instancePostfix;
  string apiPrefix;
  string blockInstanceName;
  ios_base local_138 [264];
  
  lVar10 = *(long *)(resultVar + 0x18);
  lVar14 = *(long *)(resultVar + 0x20);
  if (0 < (int)((ulong)(lVar14 - lVar10) >> 4)) {
    bVar22 = (byte)blockPointers ^ 1;
    uVar25 = (uint)bVar22 * 0x800 + 0x800;
    ppBVar1 = &(layout->blocks).
               super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    uVar18 = 0;
    do {
      __lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
               (lVar10 + uVar18 * 0x10);
      if ((*(uint *)((long)&__lhs[2].field_2 + 0xc) & (uint)bVar22 * 0x200 + 0x200) != 0) {
        sVar3 = __lhs[1]._M_string_length;
        iVar2 = *(int *)((long)&__lhs[2].field_2 + 8);
        iVar15 = 1;
        if (1 < iVar2) {
          iVar15 = iVar2;
        }
        if (sVar3 == 0) {
          apiPrefix._M_dataplus._M_p = (pointer)&apiPrefix.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&apiPrefix,"");
        }
        else {
          apiPrefix._M_dataplus._M_p = (pointer)&apiPrefix.field_2;
          pcVar23 = (__lhs->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&apiPrefix,pcVar23,pcVar23 + __lhs->_M_string_length);
          std::__cxx11::string::append((char *)&apiPrefix);
        }
        if (iVar2 < 1) {
          iVar15 = 1;
        }
        local_2a8 = 0;
        do {
          if (iVar2 < 1) {
            instancePostfix._M_dataplus._M_p = (pointer)&instancePostfix.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&instancePostfix,"");
          }
          else {
            srcName._M_dataplus._M_p = (pointer)&srcName.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&srcName,"[","");
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&blockInstanceName);
            std::ostream::operator<<(&blockInstanceName,local_2a8);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&blockInstanceName);
            std::ios_base::~ios_base(local_138);
            uVar21 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)srcName._M_dataplus._M_p != &srcName.field_2) {
              uVar21 = srcName.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar21 < apiName._M_string_length + srcName._M_string_length) {
              uVar21 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)apiName._M_dataplus._M_p != &apiName.field_2) {
                uVar21 = apiName.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar21 < apiName._M_string_length + srcName._M_string_length)
              goto LAB_0069b2ea;
              puVar7 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&apiName,0,(char *)0x0,(ulong)srcName._M_dataplus._M_p);
            }
            else {
LAB_0069b2ea:
              puVar7 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&srcName,(ulong)apiName._M_dataplus._M_p);
            }
            psVar11 = puVar7 + 2;
            if ((size_type *)*puVar7 == psVar11) {
              srcPrefix.field_2._M_allocated_capacity = *psVar11;
              srcPrefix.field_2._8_8_ = puVar7[3];
              srcPrefix._M_dataplus._M_p = (pointer)&srcPrefix.field_2;
            }
            else {
              srcPrefix.field_2._M_allocated_capacity = *psVar11;
              srcPrefix._M_dataplus._M_p = (pointer)*puVar7;
            }
            srcPrefix._M_string_length = puVar7[1];
            *puVar7 = psVar11;
            puVar7[1] = 0;
            *(char *)psVar11 = '\0';
            plVar8 = (long *)std::__cxx11::string::append((char *)&srcPrefix);
            instancePostfix._M_dataplus._M_p = (pointer)&instancePostfix.field_2;
            psVar11 = (size_type *)(plVar8 + 2);
            if ((size_type *)*plVar8 == psVar11) {
              instancePostfix.field_2._M_allocated_capacity = *psVar11;
              instancePostfix.field_2._8_8_ = plVar8[3];
            }
            else {
              instancePostfix.field_2._M_allocated_capacity = *psVar11;
              instancePostfix._M_dataplus._M_p = (pointer)*plVar8;
            }
            instancePostfix._M_string_length = plVar8[1];
            *plVar8 = (long)psVar11;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)srcPrefix._M_dataplus._M_p != &srcPrefix.field_2) {
              operator_delete(srcPrefix._M_dataplus._M_p,srcPrefix.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)apiName._M_dataplus._M_p != &apiName.field_2) {
              operator_delete(apiName._M_dataplus._M_p,apiName.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)srcName._M_dataplus._M_p != &srcName.field_2) {
              operator_delete(srcName._M_dataplus._M_p,srcName.field_2._M_allocated_capacity + 1);
            }
          }
          std::operator+(&blockInstanceName,__lhs,&instancePostfix);
          if (sVar3 == 0) {
            srcPrefix._M_dataplus._M_p = (pointer)&srcPrefix.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&srcPrefix);
          }
          else {
            std::operator+(&srcName,__lhs + 1,&instancePostfix);
            plVar8 = (long *)std::__cxx11::string::append((char *)&srcName);
            psVar11 = (size_type *)(plVar8 + 2);
            if ((size_type *)*plVar8 == psVar11) {
              srcPrefix.field_2._M_allocated_capacity = *psVar11;
              srcPrefix.field_2._8_8_ = plVar8[3];
              srcPrefix._M_dataplus._M_p = (pointer)&srcPrefix.field_2;
            }
            else {
              srcPrefix.field_2._M_allocated_capacity = *psVar11;
              srcPrefix._M_dataplus._M_p = (pointer)*plVar8;
            }
            srcPrefix._M_string_length = plVar8[1];
            *plVar8 = (long)psVar11;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)srcName._M_dataplus._M_p != &srcName.field_2) {
              operator_delete(srcName._M_dataplus._M_p,srcName.field_2._M_allocated_capacity + 1);
            }
          }
          pSVar4 = (interface->m_structs).
                   super__Vector_base<de::SharedPtr<vkt::ubo::StructType>,_std::allocator<de::SharedPtr<vkt::ubo::StructType>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar16 = (int)((long)(interface->m_structs).
                               super__Vector_base<de::SharedPtr<vkt::ubo::StructType>,_std::allocator<de::SharedPtr<vkt::ubo::StructType>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar4 >> 4) *
                   -0x33333333;
          iVar6 = -1;
          if (0 < (int)uVar16) {
            ppSVar12 = &pSVar4[4].m_state;
            uVar19 = 0;
            do {
              if ((uVar18 == *(uint *)&((SharedPtr<vkt::ubo::StructType> *)(ppSVar12 + -1))->m_ptr)
                 && (*(int *)ppSVar12 == local_2a8)) {
                iVar6 = (int)uVar19;
                break;
              }
              uVar19 = uVar19 + 1;
              ppSVar12 = ppSVar12 + 10;
            } while ((uVar16 & 0x7fffffff) != uVar19);
          }
          pBVar17 = (layout->blocks).
                    super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pBVar13 = (pointer)ppBVar1;
          pBVar20 = (pointer)ppBVar1;
          if (pBVar17 != (pointer)0x0) {
            do {
              if (iVar6 <= pBVar17->size) {
                pBVar13 = pBVar17;
              }
              pBVar17 = *(pointer *)
                         ((long)&(pBVar17->name).field_2 + (ulong)(pBVar17->size < iVar6) * 8);
            } while (pBVar17 != (pointer)0x0);
            if ((pBVar13 != (pointer)ppBVar1) && (pBVar20 = pBVar13, iVar6 < pBVar13->size)) {
              pBVar20 = (pointer)ppBVar1;
            }
          }
          pcVar23 = __lhs[2]._M_dataplus._M_p;
          pcVar9 = (pointer)__lhs[2]._M_string_length;
          if (pcVar23 != pcVar9) {
            piVar5 = (pBVar20->activeUniformIndices).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pcVar23 = pcVar23 + 0x20;
            do {
              if ((*(uint *)(pcVar23 + 0x18) & uVar25) == 0) {
                std::operator+(&srcName,&srcPrefix,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (pcVar23 + -0x20));
                matrixLoadFlag_00 = 0x69b5d8;
                std::operator+(&apiName,&apiPrefix,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (pcVar23 + -0x20));
                generateCompareSrc(src,pcVar23,(VarType *)&srcName,&apiName,(string *)interface,
                                   (UniformLayout *)(uVar18 & 0xffffffff),(int)piVar5,
                                   (void *)(ulong)uVar25,
                                   (deUint32)CONCAT71(in_register_00000089,isVertex),
                                   matrixLoadFlag_00);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)apiName._M_dataplus._M_p != &apiName.field_2) {
                  operator_delete(apiName._M_dataplus._M_p,apiName.field_2._M_allocated_capacity + 1
                                 );
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)srcName._M_dataplus._M_p != &srcName.field_2) {
                  operator_delete(srcName._M_dataplus._M_p,srcName.field_2._M_allocated_capacity + 1
                                 );
                }
                pcVar9 = (pointer)__lhs[2]._M_string_length;
              }
              pcVar24 = pcVar23 + 0x20;
              pcVar23 = pcVar23 + 0x40;
            } while (pcVar24 != pcVar9);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)srcPrefix._M_dataplus._M_p != &srcPrefix.field_2) {
            operator_delete(srcPrefix._M_dataplus._M_p,srcPrefix.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)blockInstanceName._M_dataplus._M_p != &blockInstanceName.field_2) {
            operator_delete(blockInstanceName._M_dataplus._M_p,
                            blockInstanceName.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)instancePostfix._M_dataplus._M_p != &instancePostfix.field_2) {
            operator_delete(instancePostfix._M_dataplus._M_p,
                            instancePostfix.field_2._M_allocated_capacity + 1);
          }
          local_2a8 = local_2a8 + 1;
        } while (local_2a8 != iVar15);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)apiPrefix._M_dataplus._M_p != &apiPrefix.field_2) {
          operator_delete(apiPrefix._M_dataplus._M_p,apiPrefix.field_2._M_allocated_capacity + 1);
        }
        lVar10 = *(long *)(resultVar + 0x18);
        lVar14 = *(long *)(resultVar + 0x20);
      }
      uVar18 = uVar18 + 1;
    } while ((long)uVar18 < (long)(int)((ulong)(lVar14 - lVar10) >> 4));
  }
  return;
}

Assistant:

void generateCompareSrc (std::ostringstream& src,
						 const char* resultVar,
						 const ShaderInterface& interface,
						 const UniformLayout& layout,
						 const std::map<int,
						 void*>& blockPointers,
						 bool isVertex,
						 MatrixLoadFlags matrixLoadFlag)
{
	deUint32 unusedMask = isVertex ? UNUSED_VERTEX : UNUSED_FRAGMENT;

	for (int blockNdx = 0; blockNdx < interface.getNumUniformBlocks(); blockNdx++)
	{
		const UniformBlock& block = interface.getUniformBlock(blockNdx);

		if ((block.getFlags() & (isVertex ? DECLARE_VERTEX : DECLARE_FRAGMENT)) == 0)
			continue; // Skip.

		bool			hasInstanceName	= block.hasInstanceName();
		bool			isArray			= block.isArray();
		int				numInstances	= isArray ? block.getArraySize() : 1;
		std::string		apiPrefix		= hasInstanceName ? block.getBlockName() + "." : std::string("");

		DE_ASSERT(!isArray || hasInstanceName);

		for (int instanceNdx = 0; instanceNdx < numInstances; instanceNdx++)
		{
			std::string		instancePostfix		= isArray ? std::string("[") + de::toString(instanceNdx) + "]" : std::string("");
			std::string		blockInstanceName	= block.getBlockName() + instancePostfix;
			std::string		srcPrefix			= hasInstanceName ? block.getInstanceName() + instancePostfix + "." : std::string("");
			int				blockLayoutNdx		= layout.getBlockLayoutIndex(blockNdx, instanceNdx);
			void*			basePtr				= blockPointers.find(blockLayoutNdx)->second;

			for (UniformBlock::ConstIterator uniformIter = block.begin(); uniformIter != block.end(); uniformIter++)
			{
				const Uniform& uniform = *uniformIter;

				if (uniform.getFlags() & unusedMask)
					continue; // Don't read from that uniform.

				std::string srcName = srcPrefix + uniform.getName();
				std::string apiName = apiPrefix + uniform.getName();
				generateCompareSrc(src, resultVar, uniform.getType(), srcName, apiName, layout, blockNdx, basePtr, unusedMask, matrixLoadFlag);
			}
		}
	}
}